

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseArrayValue
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  _Elt_pointer pPVar1;
  bool bVar2;
  StringPiece message;
  Status local_50;
  
  if (type == END_ARRAY) {
    (*this->ow_->_vptr_ObjectWriter[5])();
    Advance(this);
    Status::Status(__return_storage_ptr__);
  }
  else if (type == UNKNOWN) {
    message.length_ = 0x26;
    message.ptr_ = "Expected a value or ] within an array.";
    ReportUnknown(__return_storage_ptr__,this,message);
  }
  else {
    local_50.error_code_ = NOT_FOUND;
    pPVar1 = (this->stack_).c.
             super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pPVar1 == (this->stack_).c.
                  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
                (&(this->stack_).c,&local_50.error_code_);
    }
    else {
      *pPVar1 = ARRAY_MID;
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar1 + 1;
    }
    ParseValue(__return_storage_ptr__,this,type);
    Status::Status(&local_50,CANCELLED,(StringPiece)ZEXT816(0x352cac));
    bVar2 = Status::operator==(__return_storage_ptr__,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.error_message_._M_dataplus._M_p != &local_50.error_message_.field_2) {
      operator_delete(local_50.error_message_._M_dataplus._M_p);
    }
    if (bVar2) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::pop_back(&(this->stack_).c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseArrayValue(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected a value or ] within an array.");
  }

  if (type == END_ARRAY) {
    ow_->EndList();
    Advance();
    return util::Status();
  }

  // The ParseValue call may push something onto the stack so we need to make
  // sure an ARRAY_MID is after it, so we push it on now. Also, the parsing of
  // empty-null array value is relying on this ARRAY_MID token.
  stack_.push(ARRAY_MID);
  util::Status result = ParseValue(type);
  if (result == util::Status(util::error::CANCELLED, "")) {
    // If we were cancelled, pop back off the ARRAY_MID so we don't try to
    // push it on again when we try over.
    stack_.pop();
  }
  return result;
}